

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void __thiscall
spirv_cross::SPIRExpression::SPIRExpression
          (SPIRExpression *this,string *expr,TypeID expression_type_,bool immutable_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  *(undefined8 *)&(this->super_IVariant).self = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRExpression_003fd2c8;
  paVar1 = &(this->expression).field_2;
  (this->expression)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (expr->_M_dataplus)._M_p;
  paVar2 = &expr->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&expr->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->expression).field_2 + 8) = uVar4;
  }
  else {
    (this->expression)._M_dataplus._M_p = pcVar3;
    (this->expression).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->expression)._M_string_length = expr->_M_string_length;
  (expr->_M_dataplus)._M_p = (pointer)paVar2;
  expr->_M_string_length = 0;
  (expr->field_2)._M_local_buf[0] = '\0';
  (this->expression_type).id = expression_type_.id;
  (this->loaded_from).id = 0;
  this->immutable = immutable_;
  this->need_transpose = false;
  this->access_chain = false;
  this->access_meshlet_position_y = false;
  (this->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
       = (TypedID<(spirv_cross::Types)0> *)0x0;
  (this->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  (this->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
       = (TypedID<(spirv_cross::Types)0> *)&(this->expression_dependencies).stack_storage;
  (this->expression_dependencies).buffer_capacity = 8;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)0x0;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)&(this->implied_read_expressions).stack_storage;
  (this->implied_read_expressions).buffer_capacity = 8;
  this->emitted_loop_level = 0;
  return;
}

Assistant:

TypedID(uint32_t id_)
	    : id(id_)
	{
	}